

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_io.cc
# Opt level: O2

pos_type gimage::anon_unknown_11::readPNMHeader
                   (char *name,int *ncomp,long *maxval,float *scale,long *width,long *height)

{
  bool bVar1;
  long lVar2;
  ostream *poVar3;
  IOException *pIVar4;
  istream *in_00;
  istream *extraout_RDX;
  istream *extraout_RDX_00;
  istream *extraout_RDX_01;
  istream *extraout_RDX_02;
  istream *piVar5;
  istream *in_01;
  istream *extraout_RDX_03;
  istream *in_02;
  int iVar6;
  double dVar7;
  pos_type pVar8;
  string s;
  string local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  ostringstream ss;
  ifstream in;
  
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  std::ifstream::ifstream(&in);
  std::ios::exceptions((int)&in + (int)*(undefined8 *)(_in + -0x18));
  std::ifstream::open((char *)&in,(_Ios_Openmode)name);
  (anonymous_namespace)::readPNMToken_abi_cxx11_((string *)&ss,(_anonymous_namespace_ *)&in,in_00);
  std::__cxx11::string::operator=((string *)&s,(string *)&ss);
  std::__cxx11::string::~string((string *)&ss);
  bVar1 = std::operator==(&s,"P5");
  iVar6 = 1;
  piVar5 = extraout_RDX;
  if (!bVar1) {
    bVar1 = std::operator==(&s,"Pf");
    piVar5 = extraout_RDX_00;
    if (!bVar1) {
      bVar1 = std::operator==(&s,"P6");
      iVar6 = 3;
      piVar5 = extraout_RDX_01;
      if (!bVar1) {
        bVar1 = std::operator==(&s,"PF");
        piVar5 = extraout_RDX_02;
        if (!bVar1) {
          pIVar4 = (IOException *)__cxa_allocate_exception(0x28);
          std::operator+(&local_3d0,"Unknown PNM image type \'",&s);
          std::operator+(&local_3f0,&local_3d0,"\' of image ");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                         &local_3f0,name);
          gutil::IOException::IOException(pIVar4,(string *)&ss);
          __cxa_throw(pIVar4,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
        }
      }
    }
  }
  *ncomp = iVar6;
  (anonymous_namespace)::readPNMToken_abi_cxx11_((string *)&ss,(_anonymous_namespace_ *)&in,piVar5);
  lVar2 = atol(_ss);
  *width = lVar2;
  std::__cxx11::string::~string((string *)&ss);
  (anonymous_namespace)::readPNMToken_abi_cxx11_((string *)&ss,(_anonymous_namespace_ *)&in,in_01);
  lVar2 = atol(_ss);
  *height = lVar2;
  std::__cxx11::string::~string((string *)&ss);
  *maxval = 0;
  *scale = 0.0;
  bVar1 = std::operator==(&s,"Pf");
  piVar5 = extraout_RDX_03;
  if (!bVar1) {
    bVar1 = std::operator==(&s,"PF");
    piVar5 = in_02;
    if (!bVar1) {
      (anonymous_namespace)::readPNMToken_abi_cxx11_
                ((string *)&ss,(_anonymous_namespace_ *)&in,in_02);
      lVar2 = atol(_ss);
      *maxval = lVar2;
      goto LAB_00118185;
    }
  }
  (anonymous_namespace)::readPNMToken_abi_cxx11_((string *)&ss,(_anonymous_namespace_ *)&in,piVar5);
  dVar7 = atof(_ss);
  *scale = (float)dVar7;
LAB_00118185:
  std::__cxx11::string::~string((string *)&ss);
  if (((*width != 0) && (*height != 0)) && ((*maxval != 0 || ((*scale != 0.0 || (NAN(*scale))))))) {
    pVar8 = (pos_type)std::istream::tellg();
    std::ifstream::close();
    std::ifstream::~ifstream(&in);
    std::__cxx11::string::~string((string *)&s);
    return pVar8;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  poVar3 = std::operator<<((ostream *)&ss,"Invalid PNM image (");
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  poVar3 = std::operator<<(poVar3," ");
  std::ostream::_M_insert<long>((long)poVar3);
  poVar3 = std::operator<<((ostream *)&ss," ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*scale);
  poVar3 = std::operator<<(poVar3,") of image ");
  std::operator<<(poVar3,name);
  pIVar4 = (IOException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  gutil::IOException::IOException(pIVar4,&local_3f0);
  __cxa_throw(pIVar4,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

std::istream::pos_type readPNMHeader(const char *name, int &ncomp, long &maxval,
                                     float &scale, long &width, long &height)
{
  std::string            s;
  std::istream::pos_type ret=0;

  try
  {
    std::ifstream in;
    in.exceptions(std::ios_base::failbit | std::ios_base::badbit | std::ios_base::eofbit);
    in.open(name, std::ios::binary);

    s=readPNMToken(in);

    if (s == "P5" || s == "Pf")
    {
      ncomp=1;
    }
    else if (s == "P6" || s == "PF")
    {
      ncomp=3;
    }
    else
    {
      throw gutil::IOException("Unknown PNM image type '"+s+"' of image "+name);
    }

    width=atol(readPNMToken(in).c_str());
    height=atol(readPNMToken(in).c_str());

    maxval=0;
    scale=0;

    if (s == "Pf" || s == "PF")
    {
      scale=static_cast<float>(atof(readPNMToken(in).c_str()));
    }
    else
    {
      maxval=atol(readPNMToken(in).c_str());
    }

    if (width == 0 || height == 0 || (maxval == 0 && scale== 0))
    {
      std::ostringstream ss;
      ss << "Invalid PNM image (" << width << " " << height << " " << maxval;
      ss << " " << scale << ") of image " << name;
      throw gutil::IOException(ss.str());
    }

    ret=in.tellg();
    in.close();
  }
  catch (const std::ios_base::failure &ex)
  {
    throw gutil::IOException(ex.what());
  }

  return ret;
}